

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpoint.cpp
# Opt level: O1

QDebug operator<<(QDebug dbg,QPoint *p)

{
  QPoint this;
  storage_type *in_RCX;
  int *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QDebugStateSaver saver;
  QDebugStateSaver local_48;
  QString local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_48,(QDebug *)p);
  this = *p;
  *(undefined1 *)&((QTextStream *)((long)this + 0x30))->_vptr_QTextStream = 0;
  ba.m_data = in_RCX;
  ba.m_size = (qsizetype)"QPoint";
  QString::fromUtf8(&local_40,(QString *)0x6,ba);
  QTextStream::operator<<((QTextStream *)this,&local_40);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(char *)&((QTextStream *)((long)*p + 0x30))->_vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)*p,' ');
  }
  QTextStream::operator<<((QTextStream *)*p,'(');
  if (*(char *)&((QTextStream *)((long)*p + 0x30))->_vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)*p,' ');
  }
  QTextStream::operator<<((QTextStream *)*p,*in_RDX);
  if (*(char *)&((QTextStream *)((long)*p + 0x30))->_vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)*p,' ');
  }
  QTextStream::operator<<((QTextStream *)*p,',');
  if (*(char *)&((QTextStream *)((long)*p + 0x30))->_vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)*p,' ');
  }
  QTextStream::operator<<((QTextStream *)*p,in_RDX[1]);
  if (*(char *)&((QTextStream *)((long)*p + 0x30))->_vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)*p,' ');
  }
  QTextStream::operator<<((QTextStream *)*p,')');
  if (*(char *)&((QTextStream *)((long)*p + 0x30))->_vptr_QTextStream == '\x01') {
    QTextStream::operator<<((QTextStream *)*p,' ');
  }
  p->xp = 0;
  p->yp = 0;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)*p;
  QDebugStateSaver::~QDebugStateSaver(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QPoint &p)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace();
    dbg << "QPoint" << '(';
    QtDebugUtils::formatQPoint(dbg, p);
    dbg << ')';
    return dbg;
}